

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O0

CURLcode set_trace_config(GlobalConfig *global,char *config)

{
  int iVar1;
  char *__s;
  _Bool local_41;
  char *pcStack_40;
  _Bool toggle;
  char *name;
  char *tmp;
  char *token;
  CURLcode result;
  char *config_local;
  GlobalConfig *global_local;
  
  token._4_4_ = CURLE_OK;
  __s = strdup(config);
  if (__s == (char *)0x0) {
    global_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    tmp = strtok(__s,", ");
    while (tmp != (char *)0x0) {
      if (*tmp == '+') {
        local_41 = true;
        pcStack_40 = tmp + 1;
      }
      else if (*tmp == '-') {
        local_41 = false;
        pcStack_40 = tmp + 1;
      }
      else {
        local_41 = true;
        pcStack_40 = tmp;
      }
      iVar1 = curl_strequal(pcStack_40,"all");
      if (iVar1 == 0) {
        iVar1 = curl_strequal(pcStack_40,"ids");
        if (iVar1 == 0) {
          iVar1 = curl_strequal(pcStack_40,"time");
          if (iVar1 == 0) {
            token._4_4_ = curl_global_trace(tmp);
            goto joined_r0x00114ffe;
          }
          global->tracetime = local_41;
        }
        else {
          global->traceids = local_41;
        }
      }
      else {
        global->traceids = local_41;
        global->tracetime = local_41;
        token._4_4_ = curl_global_trace(tmp);
joined_r0x00114ffe:
        if (token._4_4_ != CURLE_OK) break;
      }
      tmp = strtok((char *)0x0,", ");
    }
    free(__s);
    global_local._4_4_ = token._4_4_;
  }
  return global_local._4_4_;
}

Assistant:

static CURLcode set_trace_config(struct GlobalConfig *global,
                                 const char *config)
{
  CURLcode result = CURLE_OK;
  char *token, *tmp, *name;
  bool toggle;

  tmp = strdup(config);
  if(!tmp)
    return CURLE_OUT_OF_MEMORY;

  /* Allow strtok() here since this is not used threaded */
  /* !checksrc! disable BANNEDFUNC 2 */
  token = strtok(tmp, ", ");
  while(token) {
    switch(*token) {
      case '-':
        toggle = FALSE;
        name = token + 1;
        break;
      case '+':
        toggle = TRUE;
        name = token + 1;
        break;
      default:
        toggle = TRUE;
        name = token;
        break;
    }

    if(strcasecompare(name, "all")) {
      global->traceids = toggle;
      global->tracetime = toggle;
      result = curl_global_trace(token);
      if(result)
        goto out;
    }
    else if(strcasecompare(name, "ids")) {
      global->traceids = toggle;
    }
    else if(strcasecompare(name, "time")) {
      global->tracetime = toggle;
    }
    else {
      result = curl_global_trace(token);
      if(result)
        goto out;
    }
    token = strtok(NULL, ", ");
  }
out:
  free(tmp);
  return result;
}